

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewDocNode(xmlDocPtr doc,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  xmlChar *pxVar1;
  xmlChar *dictName;
  xmlChar *copy;
  xmlNodePtr cur;
  xmlChar *content_local;
  xmlChar *name_local;
  xmlNsPtr ns_local;
  xmlDocPtr doc_local;
  
  if (name == (xmlChar *)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else if ((doc == (xmlDocPtr)0x0) || (doc->dict == (_xmlDict *)0x0)) {
    pxVar1 = xmlStrdup(name);
    if (pxVar1 == (xmlChar *)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      doc_local = (xmlDocPtr)xmlNewElem(doc,ns,pxVar1,content);
      if (doc_local == (xmlDocPtr)0x0) {
        (*xmlFree)(pxVar1);
        doc_local = (xmlDocPtr)0x0;
      }
    }
  }
  else {
    pxVar1 = xmlDictLookup(doc->dict,name,-1);
    if (pxVar1 == (xmlChar *)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      doc_local = (xmlDocPtr)xmlNewElem(doc,ns,pxVar1,content);
    }
  }
  return (xmlNodePtr)doc_local;
}

Assistant:

xmlNodePtr
xmlNewDocNode(xmlDocPtr doc, xmlNsPtr ns,
              const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur;
    xmlChar *copy;

    if (name == NULL)
        return(NULL);

    if ((doc != NULL) && (doc->dict != NULL)) {
        const xmlChar *dictName = xmlDictLookup(doc->dict, name, -1);

        if (dictName == NULL)
            return(NULL);
        return(xmlNewElem(doc, ns, dictName, content));
    }

    copy = xmlStrdup(name);
    if (copy == NULL)
        return(NULL);

    cur = xmlNewElem(doc, ns, copy, content);
    if (cur == NULL) {
        xmlFree(copy);
        return(NULL);
    }

    return(cur);
}